

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O1

JsErrorCode JsGetPromiseResult(JsValueRef promise,JsValueRef *result)

{
  ScriptContext *scriptContext;
  ScriptContext *pSVar1;
  void *pvVar2;
  code *pcVar3;
  bool bVar4;
  JsErrorCode JVar5;
  JsrtContext *currentContext;
  undefined4 *puVar6;
  RecyclableObject *value;
  JavascriptPromise *pJVar7;
  ScriptContext *__localScriptContext;
  void *unaff_retaddr;
  undefined1 auStack_98 [8];
  TTDebuggerAbortException anon_var_0;
  undefined1 local_58 [8];
  EnterScriptObject __enterScriptObject;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  currentContext = JsrtContext::GetCurrent();
  JVar5 = CheckContext(currentContext,false,false);
  if (JVar5 != JsNoError) {
    return JVar5;
  }
  scriptContext =
       (((currentContext->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            ((AutoNestedHandledExceptionType *)((long)&__enterScriptObject.library + 4),
             ExceptionType_JavascriptException|ExceptionType_OutOfMemory);
  anon_var_0.m_staticAbortMessage = (char16 *)0x0;
  anon_var_0.m_optEventTime = 0;
  anon_var_0.m_optMoveMode = 0;
  auStack_98 = (undefined1  [8])0x0;
  anon_var_0.m_abortCode = 0;
  anon_var_0._4_4_ = 0;
  Js::EnterScriptObject::EnterScriptObject
            ((EnterScriptObject *)local_58,scriptContext,(ScriptEntryExitRecord *)auStack_98,
             unaff_retaddr,&stack0x00000000,true,true,true);
  Js::ScriptContext::OnScriptStart(scriptContext,true,true);
  Js::EnterScriptObject::VerifyEnterScript((EnterScriptObject *)local_58);
  if (scriptContext->TTDShouldPerformRecordAction == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Core/JsrtCore.cpp"
                       ,0x401,"(false)","Need to implement support here!!!");
    if (!bVar4) goto LAB_003cbcda;
    *puVar6 = 0;
  }
  JVar5 = JsErrorInvalidArgument;
  if (promise != (JsValueRef)0x0) {
    if ((ulong)promise >> 0x30 == 0) {
      value = Js::VarTo<Js::RecyclableObject>(promise);
      pSVar1 = (((((value->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
               scriptContext.ptr;
      if (pSVar1 != scriptContext) {
        JVar5 = JsErrorWrongRuntime;
        if (pSVar1->threadContext != scriptContext->threadContext) goto LAB_003cb9f3;
        promise = Js::CrossSite::MarshalVar(scriptContext,value,false);
      }
    }
    if (result == (JsValueRef *)0x0) {
      JVar5 = JsErrorNullArgument;
    }
    else {
      *result = (JsValueRef)0x0;
      bVar4 = Js::VarIs<Js::JavascriptPromise>(promise);
      JVar5 = JsErrorInvalidArgument;
      if (bVar4) {
        pJVar7 = Js::VarTo<Js::JavascriptPromise>(promise);
        pvVar2 = (pJVar7->result).ptr;
        if (pvVar2 == (void *)0x0) {
          JVar5 = JsErrorPromisePending;
        }
        else {
          *result = pvVar2;
          JVar5 = JsNoError;
        }
      }
    }
  }
LAB_003cb9f3:
  Js::EnterScriptObject::~EnterScriptObject((EnterScriptObject *)local_58);
  if (((JVar5 - JsErrorNoCurrentContext < 7) &&
      ((0x43U >> (JVar5 - JsErrorNoCurrentContext & 0x1f) & 1) != 0)) || (JVar5 == JsErrorFatal)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Core/../JsrtInternal.h"
                       ,0xcc,
                       "(errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated)"
                       ,
                       "errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated"
                      );
    if (!bVar4) {
LAB_003cbcda:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
            ((AutoNestedHandledExceptionType *)((long)&__enterScriptObject.library + 4));
  return JVar5;
}

Assistant:

CHAKRA_API JsGetPromiseResult(_In_ JsValueRef promise, _Out_ JsValueRef *result)
{
    return ContextAPIWrapper<JSRT_MAYBE_TRUE>([&](Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION_NOT_IMPLEMENTED(scriptContext);

        VALIDATE_INCOMING_REFERENCE(promise, scriptContext);
        PARAM_NOT_NULL(result);

        *result = JS_INVALID_REFERENCE;

        if (!Js::VarIs<Js::JavascriptPromise>(promise))
        {
            return JsErrorInvalidArgument;
        }

        Js::JavascriptPromise *jsPromise = Js::VarTo<Js::JavascriptPromise>(promise);
        Js::Var jsResult = jsPromise->GetResult();

        if (jsResult == nullptr)
        {
            return JsErrorPromisePending;
        }

        *result = (JsValueRef)jsResult;
        return JsNoError;
    });
}